

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BaseVertexGroup::init
          (BaseVertexGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  int extraout_EAX;
  DrawTest *this_00;
  RenderContext *renderCtx;
  char *desc_00;
  IndexType type;
  IndexType type_00;
  char *pcVar1;
  string local_248;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  string iterationDesc;
  int iterationNdx;
  DrawTest *test;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string desc;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string name;
  IndexTest *indexTest;
  int testNdx;
  undefined1 local_c8 [8];
  DrawTestSpec spec;
  IndexTest tests [6];
  BaseVertexGroup *this_local;
  
  spec.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000001;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_c8);
  genBasicSpec((DrawTestSpec *)local_c8,this->m_method);
  spec.indexType = INDEXTYPE_SHORT;
  for (indexTest._0_4_ = 0; (int)indexTest < 6; indexTest._0_4_ = (int)indexTest + 1) {
    name.field_2._8_8_ = tests[(long)(int)indexTest + -1].baseVertex;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"index_",&local_141);
    pcVar1 = "neg_";
    if ((*(byte *)name.field_2._8_8_ & 1) != 0) {
      pcVar1 = "";
    }
    std::operator+(&local_120,&local_140,pcVar1);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)(ulong)*(uint *)(name.field_2._8_8_ + 4),type);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                   &local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&desc.field_2 + 8));
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"index ",&local_1a9);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              ((string *)&test,(DrawTestSpec *)(ulong)*(uint *)(name.field_2._8_8_ + 4),type_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   &local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&test);
    std::__cxx11::string::~string((string *)&test);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    this_00 = (DrawTest *)operator_new(0x138);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    renderCtx = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    desc_00 = (char *)std::__cxx11::string::c_str();
    deqp::gls::DrawTest::DrawTest(this_00,testCtx,renderCtx,pcVar1,desc_00);
    spec.primitiveCount = *(int *)(name.field_2._8_8_ + 4);
    for (iterationDesc.field_2._12_4_ = 0; (int)iterationDesc.field_2._12_4_ < 2;
        iterationDesc.field_2._12_4_ = iterationDesc.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"base vertex ",&local_221);
      de::toString<int>(&local_248,
                        (int *)(name.field_2._8_8_ + 8 + (long)(int)iterationDesc.field_2._12_4_ * 4
                               ));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     &local_220,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      spec.instanceCount =
           *(int *)(name.field_2._8_8_ + 8 + (long)(int)iterationDesc.field_2._12_4_ * 4);
      pcVar1 = (char *)std::__cxx11::string::c_str();
      deqp::gls::DrawTest::addIteration(this_00,(DrawTestSpec *)local_c8,pcVar1);
      std::__cxx11::string::~string((string *)local_200);
    }
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)local_100);
  }
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_c8);
  return extraout_EAX;
}

Assistant:

void BaseVertexGroup::init (void)
{
	struct IndexTest
	{
		bool							positiveBase;
		gls::DrawTestSpec::IndexType	type;
		int								baseVertex[2];
	};

	const IndexTest tests[] =
	{
		{ true,  gls::DrawTestSpec::INDEXTYPE_BYTE,		{  1,  2 } },
		{ true,  gls::DrawTestSpec::INDEXTYPE_SHORT,	{  1,  2 } },
		{ true,  gls::DrawTestSpec::INDEXTYPE_INT,		{  1,  2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_BYTE,		{ -1, -2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_SHORT,	{ -1, -2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_INT,		{ -1, -2 } },
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	spec.indexStorage = gls::DrawTestSpec::STORAGE_BUFFER;

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&	indexTest	= tests[testNdx];

		const std::string	name		= std::string("index_") + (indexTest.positiveBase ? "" : "neg_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string	desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		gls::DrawTest*		test		= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.indexType			= indexTest.type;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.baseVertex); ++iterationNdx)
		{
			const std::string iterationDesc = std::string("base vertex ") + de::toString(indexTest.baseVertex[iterationNdx]);
			spec.baseVertex	= indexTest.baseVertex[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		addChild(test);
	}
}